

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt.cpp
# Opt level: O1

color_quad_u8 __thiscall
crnlib::dxt1_block::unpack_endpoint
          (dxt1_block *this,uint32 endpoints,uint index,bool scaled,uint alpha)

{
  unpack_color(this,(uint16)(endpoints >> ((byte)(index << 4) & 0x1f)),scaled,alpha);
  return (color_quad_u8)SUB84(this,0);
}

Assistant:

color_quad_u8 dxt1_block::unpack_endpoint(uint32 endpoints, uint index, bool scaled, uint alpha) {
  CRNLIB_ASSERT(index < 2);
  return unpack_color(static_cast<uint16>((endpoints >> (index * 16U)) & 0xFFFFU), scaled, alpha);
}